

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall RPCArg::GetName_abi_cxx11_(string *__return_storage_ptr__,RPCArg *this)

{
  size_type sVar1;
  long in_FS_OFFSET;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&this->m_names,'|',0);
  local_19 = sVar1 == 0xffffffffffffffff;
  inline_check_non_fatal<bool>
            (&local_19,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
             ,0x39c,"GetName","std::string::npos == m_names.find(\'|\')");
  std::__cxx11::string::string((string *)__return_storage_ptr__,&this->m_names);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string RPCArg::GetName() const
{
    CHECK_NONFATAL(std::string::npos == m_names.find('|'));
    return m_names;
}